

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *psVar2;
  uchar *puVar3;
  uchar *puVar4;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  u8 *unaff_retaddr;
  compareInfo *pInfo;
  sqlite3 *db;
  int nPat;
  u32 escape;
  uchar *zB;
  uchar *zA;
  uchar *zEsc;
  compareInfo backupInfo;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  sqlite3_context *in_stack_ffffffffffffffa0;
  compareInfo *in_stack_ffffffffffffffe8;
  u8 *zString;
  
  zString = *(u8 **)(in_FS_OFFSET + 0x28);
  psVar2 = sqlite3_context_db_handle(in_RDI);
  sqlite3_user_data(in_RDI);
  iVar1 = sqlite3_value_bytes((sqlite3_value *)0x21ef17);
  if (psVar2->aLimit[8] < iVar1) {
    sqlite3_result_error
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    goto LAB_0021f094;
  }
  if (in_ESI == 3) {
    in_stack_ffffffffffffffe8 = (compareInfo *)sqlite3_value_text((sqlite3_value *)0x21ef60);
    if (in_stack_ffffffffffffffe8 == (compareInfo *)0x0) goto LAB_0021f094;
    iVar1 = sqlite3Utf8CharLen((char *)in_stack_ffffffffffffffe8,-1);
    if (iVar1 != 1) {
      sqlite3_result_error
                (in_stack_ffffffffffffffa0,
                 (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      goto LAB_0021f094;
    }
    sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe8);
  }
  puVar3 = sqlite3_value_text((sqlite3_value *)0x21f035);
  puVar4 = sqlite3_value_text((sqlite3_value *)0x21f048);
  if ((puVar4 != (uchar *)0x0) && (puVar3 != (uchar *)0x0)) {
    patternCompare(unaff_retaddr,zString,in_stack_ffffffffffffffe8,(u32)((ulong)in_RDI >> 0x20));
    sqlite3_result_int(in_RDI,in_stack_ffffffffffffff9c);
  }
LAB_0021f094:
  if (*(u8 **)(in_FS_OFFSET + 0x28) == zString) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void likeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);
  struct compareInfo backupInfo;

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context,
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
    if( escape==pInfo->matchAll || escape==pInfo->matchOne ){
      memcpy(&backupInfo, pInfo, sizeof(backupInfo));
      pInfo = &backupInfo;
      if( escape==pInfo->matchAll ) pInfo->matchAll = 0;
      if( escape==pInfo->matchOne ) pInfo->matchOne = 0;
    }
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}